

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O1

void aom_scaled_2d_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                        InterpKernel *filter,int x0_q4,int x_step_q4,int y0_q4,int y_step_q4,int w,
                        int h)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  unkbyte10 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [12];
  undefined1 auVar24 [13];
  undefined1 auVar25 [16];
  undefined1 auVar26 [11];
  undefined1 auVar27 [12];
  undefined1 auVar28 [13];
  undefined1 auVar29 [11];
  undefined1 auVar30 [12];
  undefined1 auVar31 [13];
  undefined1 auVar32 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  unkbyte10 Var42;
  undefined1 auVar43 [14];
  undefined1 auVar44 [12];
  undefined1 auVar45 [14];
  undefined1 auVar46 [12];
  unkbyte10 Var47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  int iVar52;
  ulong uVar53;
  uint uVar54;
  ulong *puVar55;
  uint8_t *puVar56;
  ulong *puVar57;
  uint8_t *puVar58;
  uint uVar59;
  uint8_t *puVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  undefined8 *puVar64;
  ulong uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar75;
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar125 [16];
  undefined4 uVar126;
  undefined8 uVar127;
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar219 [16];
  uint8_t temp_1 [64];
  uint8_t temp [9152];
  undefined8 local_2438;
  undefined1 uStack_2430;
  undefined1 uStack_242f;
  undefined1 uStack_242e;
  undefined1 uStack_242d;
  undefined1 uStack_242c;
  undefined1 uStack_242b;
  undefined1 uStack_242a;
  undefined1 uStack_2429;
  undefined8 local_2428;
  undefined1 uStack_2420;
  undefined1 uStack_241f;
  undefined1 uStack_241e;
  undefined1 uStack_241d;
  undefined1 uStack_241c;
  undefined1 uStack_241b;
  undefined1 uStack_241a;
  undefined1 uStack_2419;
  undefined8 local_2418;
  undefined1 uStack_2410;
  undefined1 uStack_240f;
  undefined1 uStack_240e;
  undefined1 uStack_240d;
  undefined1 uStack_240c;
  undefined1 uStack_240b;
  undefined1 uStack_240a;
  undefined1 uStack_2409;
  undefined8 local_2408;
  undefined8 uStack_2400;
  ulong local_23f8 [8];
  undefined8 uStack_23b8;
  undefined1 auStack_23b0 [56];
  ulong auStack_2378 [8];
  undefined8 uStack_2338;
  undefined1 auStack_2330 [56];
  ulong auStack_22f8 [8];
  undefined8 uStack_22b8;
  undefined1 auStack_22b0 [56];
  ulong auStack_2278 [8];
  undefined8 uStack_2238;
  undefined1 auStack_2230 [8704];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar76 [12];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar91 [16];
  undefined1 auVar90 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar112 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar113 [16];
  undefined1 auVar110 [16];
  undefined1 auVar109 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar128 [12];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar141 [16];
  undefined1 auVar140 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar163 [16];
  undefined1 auVar173 [16];
  undefined1 auVar164 [16];
  undefined1 auVar174 [16];
  undefined1 auVar165 [16];
  undefined1 auVar175 [16];
  undefined1 auVar166 [16];
  undefined1 auVar176 [16];
  undefined1 auVar167 [16];
  undefined1 auVar177 [16];
  undefined1 auVar168 [16];
  undefined1 auVar178 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar197 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  
  auVar70 = _DAT_0051d520;
  auVar68 = _DAT_0051d510;
  auVar67 = _DAT_0051d4e0;
  auVar66 = _DAT_0051d4c0;
  iVar52 = (h + -1) * y_step_q4 + y0_q4 >> 4;
  uVar59 = iVar52 + 8;
  if (w < 8) {
    if (-8 < iVar52) {
      puVar56 = src + src_stride * -3;
      puVar60 = puVar56 + -3;
      iVar52 = 0;
      puVar55 = local_23f8;
      do {
        if (0 < w) {
          lVar63 = 0;
          uVar54 = x0_q4;
          do {
            puVar64 = &local_2438;
            lVar62 = 0;
            do {
              if ((uVar54 & 0xf) == 0) {
                puVar58 = puVar56 + ((int)uVar54 >> 4);
                lVar61 = 0;
                do {
                  *(uint8_t *)((long)puVar64 + lVar61) = *puVar58;
                  lVar61 = lVar61 + 1;
                  puVar58 = puVar58 + src_stride;
                } while (lVar61 != 4);
              }
              else {
                puVar57 = (ulong *)(puVar60 + ((int)uVar54 >> 4));
                uVar65 = *puVar57;
                uVar127 = *(undefined8 *)((long)puVar57 + src_stride);
                auVar161._8_4_ = 0;
                auVar161._0_8_ = uVar65;
                auVar161._12_2_ = (short)(uVar65 >> 0x30);
                auVar161._14_2_ = (short)((ulong)uVar127 >> 0x30);
                auVar209._12_4_ = auVar161._12_4_;
                auVar209._8_2_ = 0;
                auVar209._0_8_ = uVar65;
                auVar209._10_2_ = (short)((ulong)uVar127 >> 0x20);
                auVar133._10_6_ = auVar209._10_6_;
                auVar133._8_2_ = (short)(uVar65 >> 0x20);
                auVar133._0_8_ = uVar65;
                auVar50._4_8_ = auVar133._8_8_;
                auVar50._2_2_ = (short)((ulong)uVar127 >> 0x10);
                auVar50._0_2_ = (short)(uVar65 >> 0x10);
                auVar210._0_4_ = CONCAT22((short)uVar127,(short)uVar65);
                auVar210._4_12_ = auVar50;
                uVar65 = *(ulong *)((long)puVar57 + src_stride * 2);
                uVar127 = *(undefined8 *)((long)puVar57 + src_stride * 3);
                auVar145._8_4_ = 0;
                auVar145._0_8_ = uVar65;
                auVar145._12_2_ = (short)(uVar65 >> 0x30);
                auVar145._14_2_ = (short)((ulong)uVar127 >> 0x30);
                auVar144._12_4_ = auVar145._12_4_;
                auVar144._8_2_ = 0;
                auVar144._0_8_ = uVar65;
                auVar144._10_2_ = (short)((ulong)uVar127 >> 0x20);
                auVar143._10_6_ = auVar144._10_6_;
                auVar143._8_2_ = (short)(uVar65 >> 0x20);
                auVar143._0_8_ = uVar65;
                auVar51._4_8_ = auVar143._8_8_;
                auVar51._2_2_ = (short)((ulong)uVar127 >> 0x10);
                auVar51._0_2_ = (short)(uVar65 >> 0x10);
                auVar169._6_2_ = (short)uVar127;
                auVar169._4_2_ = (short)uVar65;
                auVar170._0_8_ = auVar210._0_8_;
                auVar170._8_4_ = auVar50._0_4_;
                auVar170._12_4_ = auVar51._0_4_;
                auVar169._8_8_ = auVar170._8_8_;
                auVar169._0_4_ = auVar210._0_4_;
                auVar198._8_8_ = 0;
                auVar198._0_8_ = auVar169._8_8_;
                auVar180._4_4_ = auVar143._8_4_;
                auVar180._0_4_ = auVar133._8_4_;
                auVar180._8_4_ = auVar209._12_4_;
                auVar180._12_4_ = auVar144._12_4_;
                auVar161 = *(undefined1 (*) [16])((long)*filter + (ulong)((uVar54 & 0xf) << 4));
                auVar133 = pshufb(auVar161,_DAT_0051d4c0);
                auVar209 = pshufb(auVar161,ZEXT816(0x604060406040604));
                auVar209 = pmaddubsw(auVar198,auVar209);
                auVar210 = pshufb(auVar161,_DAT_0051d4e0);
                auVar161 = pshufb(auVar161,ZEXT816(0xe0c0e0c0e0c0e0c));
                auVar161 = pmaddubsw(auVar180 >> 0x40,auVar161);
                auVar146._0_2_ = auVar161._0_2_ + auVar209._0_2_;
                auVar146._2_2_ = auVar161._2_2_ + auVar209._2_2_;
                auVar146._4_2_ = auVar161._4_2_ + auVar209._4_2_;
                auVar146._6_2_ = auVar161._6_2_ + auVar209._6_2_;
                auVar146._8_2_ = auVar161._8_2_ + auVar209._8_2_;
                auVar146._10_2_ = auVar161._10_2_ + auVar209._10_2_;
                auVar146._12_2_ = auVar161._12_2_ + auVar209._12_2_;
                auVar146._14_2_ = auVar161._14_2_ + auVar209._14_2_;
                auVar209 = pmaddubsw(auVar169,auVar133);
                auVar161 = pmaddubsw(auVar180,auVar210);
                auVar114._0_2_ = auVar161._0_2_ + auVar209._0_2_ + 0x40;
                auVar114._2_2_ = auVar161._2_2_ + auVar209._2_2_ + 0x40;
                auVar114._4_2_ = auVar161._4_2_ + auVar209._4_2_ + 0x40;
                auVar114._6_2_ = auVar161._6_2_ + auVar209._6_2_ + 0x40;
                auVar114._8_2_ = auVar161._8_2_ + auVar209._8_2_ + 0x40;
                auVar114._10_2_ = auVar161._10_2_ + auVar209._10_2_ + 0x40;
                auVar114._12_2_ = auVar161._12_2_ + auVar209._12_2_ + 0x40;
                auVar114._14_2_ = auVar161._14_2_ + auVar209._14_2_ + 0x40;
                auVar161 = paddsw(auVar114,auVar146);
                auVar161 = psraw(auVar161,7);
                sVar5 = auVar161._0_2_;
                sVar6 = auVar161._2_2_;
                sVar7 = auVar161._4_2_;
                sVar8 = auVar161._6_2_;
                *(uint *)((long)&local_2438 + lVar62 * 4) =
                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar161[6] - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar161[4] - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar161[2] -
                                                (0xff < sVar6),
                                                (0 < sVar5) * (sVar5 < 0x100) * auVar161[0] -
                                                (0xff < sVar5))));
              }
              uVar54 = uVar54 + x_step_q4;
              lVar62 = lVar62 + 1;
              puVar64 = (undefined8 *)((long)puVar64 + 4);
            } while (lVar62 != 4);
            auVar25[8] = uStack_2430;
            auVar25._0_8_ = local_2438;
            auVar25[9] = uStack_242f;
            auVar25[10] = uStack_242e;
            auVar25[0xb] = uStack_242d;
            auVar25[0xc] = uStack_242c;
            auVar25[0xd] = uStack_242b;
            auVar25[0xe] = uStack_242a;
            auVar25[0xf] = uStack_2429;
            auVar161 = pshufb(auVar25,_DAT_0051d500);
            *(int *)((long)puVar55 + lVar63) = auVar161._0_4_;
            *(int *)((long)puVar55 + lVar63 + 0x40) = auVar161._4_4_;
            *(int *)((long)puVar55 + lVar63 + 0x80) = auVar161._8_4_;
            *(int *)((long)puVar55 + lVar63 + 0xc0) = auVar161._12_4_;
            lVar63 = lVar63 + 4;
          } while (lVar63 < w);
        }
        puVar60 = puVar60 + src_stride * 4;
        puVar55 = puVar55 + 0x20;
        iVar52 = iVar52 + 4;
        puVar56 = puVar56 + src_stride * 4;
      } while (iVar52 < (int)uVar59);
    }
  }
  else {
    puVar56 = src + src_stride * -3;
    puVar60 = puVar56 + -3;
    iVar52 = (uVar59 & 0xfffffff8) + 8;
    puVar55 = local_23f8;
    do {
      uVar65 = 0;
      uVar59 = x0_q4;
      do {
        puVar64 = &local_2438;
        lVar63 = 0;
        do {
          if ((uVar59 & 0xf) == 0) {
            puVar58 = puVar56 + ((int)uVar59 >> 4);
            lVar62 = 0;
            do {
              *(uint8_t *)((long)puVar64 + lVar62) = *puVar58;
              lVar62 = lVar62 + 1;
              puVar58 = puVar58 + src_stride;
            } while (lVar62 != 8);
          }
          else {
            puVar57 = (ulong *)(puVar60 + ((int)uVar59 >> 4));
            uVar53 = *puVar57;
            uVar127 = *(undefined8 *)((long)puVar57 + src_stride);
            auVar80._8_4_ = 0;
            auVar80._0_8_ = uVar53;
            auVar80._12_2_ = (short)(uVar53 >> 0x30);
            auVar80._14_2_ = (short)((ulong)uVar127 >> 0x30);
            auVar79._12_4_ = auVar80._12_4_;
            auVar79._8_2_ = 0;
            auVar79._0_8_ = uVar53;
            auVar79._10_2_ = (short)((ulong)uVar127 >> 0x20);
            auVar78._10_6_ = auVar79._10_6_;
            auVar78._8_2_ = (short)(uVar53 >> 0x20);
            auVar78._0_8_ = uVar53;
            auVar33._4_8_ = auVar78._8_8_;
            auVar33._2_2_ = (short)((ulong)uVar127 >> 0x10);
            auVar33._0_2_ = (short)(uVar53 >> 0x10);
            auVar77._0_4_ = CONCAT22((short)uVar127,(short)uVar53);
            auVar77._4_12_ = auVar33;
            uVar53 = *(ulong *)((long)puVar57 + src_stride * 2);
            uVar127 = *(undefined8 *)((long)puVar57 + src_stride * 3);
            auVar131._8_4_ = 0;
            auVar131._0_8_ = uVar53;
            auVar131._12_2_ = (short)(uVar53 >> 0x30);
            auVar131._14_2_ = (short)((ulong)uVar127 >> 0x30);
            auVar130._12_4_ = auVar131._12_4_;
            auVar130._8_2_ = 0;
            auVar130._0_8_ = uVar53;
            auVar130._10_2_ = (short)((ulong)uVar127 >> 0x20);
            auVar129._10_6_ = auVar130._10_6_;
            auVar129._8_2_ = (short)(uVar53 >> 0x20);
            auVar129._0_8_ = uVar53;
            auVar34._4_8_ = auVar129._8_8_;
            auVar34._2_2_ = (short)((ulong)uVar127 >> 0x10);
            auVar34._0_2_ = (short)(uVar53 >> 0x10);
            auVar132._6_2_ = (short)uVar127;
            auVar132._4_2_ = (short)uVar53;
            uVar53 = *(ulong *)((long)puVar57 + src_stride * 4);
            uVar127 = *(undefined8 *)((long)puVar57 + src_stride * 5);
            auVar159._8_4_ = 0;
            auVar159._0_8_ = uVar53;
            auVar159._12_2_ = (short)(uVar53 >> 0x30);
            auVar159._14_2_ = (short)((ulong)uVar127 >> 0x30);
            auVar158._12_4_ = auVar159._12_4_;
            auVar158._8_2_ = 0;
            auVar158._0_8_ = uVar53;
            auVar158._10_2_ = (short)((ulong)uVar127 >> 0x20);
            auVar157._10_6_ = auVar158._10_6_;
            auVar157._8_2_ = (short)(uVar53 >> 0x20);
            auVar157._0_8_ = uVar53;
            auVar35._4_8_ = auVar157._8_8_;
            auVar35._2_2_ = (short)((ulong)uVar127 >> 0x10);
            auVar35._0_2_ = (short)(uVar53 >> 0x10);
            auVar156._0_4_ = CONCAT22((short)uVar127,(short)uVar53);
            auVar156._4_12_ = auVar35;
            uVar53 = *(ulong *)((long)puVar57 + src_stride * 6);
            uVar127 = *(undefined8 *)((long)puVar57 + src_stride * 7);
            auVar192._8_4_ = 0;
            auVar192._0_8_ = uVar53;
            auVar192._12_2_ = (short)(uVar53 >> 0x30);
            auVar192._14_2_ = (short)((ulong)uVar127 >> 0x30);
            auVar191._12_4_ = auVar192._12_4_;
            auVar191._8_2_ = 0;
            auVar191._0_8_ = uVar53;
            auVar191._10_2_ = (short)((ulong)uVar127 >> 0x20);
            auVar190._10_6_ = auVar191._10_6_;
            auVar190._8_2_ = (short)(uVar53 >> 0x20);
            auVar190._0_8_ = uVar53;
            auVar36._4_8_ = auVar190._8_8_;
            auVar36._2_2_ = (short)((ulong)uVar127 >> 0x10);
            auVar36._0_2_ = (short)(uVar53 >> 0x10);
            auVar132._14_2_ = (short)uVar127;
            auVar132._12_2_ = (short)uVar53;
            auVar102._0_8_ = auVar77._0_8_;
            auVar102._8_4_ = auVar33._0_4_;
            auVar102._12_4_ = auVar34._0_4_;
            auVar132._0_4_ = auVar77._0_4_;
            auVar208._0_8_ = auVar156._0_8_;
            auVar208._8_4_ = auVar35._0_4_;
            auVar208._12_4_ = auVar36._0_4_;
            auVar132._8_4_ = auVar156._0_4_;
            auVar81._0_8_ = CONCAT44(auVar129._8_4_,auVar78._8_4_);
            auVar81._8_4_ = auVar79._12_4_;
            auVar81._12_4_ = auVar130._12_4_;
            auVar160._0_8_ = CONCAT44(auVar190._8_4_,auVar157._8_4_);
            auVar160._8_4_ = auVar158._12_4_;
            auVar160._12_4_ = auVar191._12_4_;
            auVar103._8_8_ = auVar208._8_8_;
            auVar103._0_8_ = auVar102._8_8_;
            auVar193._8_8_ = auVar160._0_8_;
            auVar193._0_8_ = auVar81._0_8_;
            auVar82._8_8_ = auVar160._8_8_;
            auVar82._0_8_ = auVar81._8_8_;
            auVar161 = *(undefined1 (*) [16])((long)*filter + (ulong)((uVar59 & 0xf) << 4));
            auVar209 = pshufb(auVar161,_DAT_0051d4c0);
            auVar133 = pmaddubsw(auVar132,auVar209);
            auVar209 = pshufb(auVar161,_DAT_0051d510);
            auVar209 = pmaddubsw(auVar103,auVar209);
            auVar210 = pshufb(auVar161,_DAT_0051d4e0);
            auVar210 = pmaddubsw(auVar193,auVar210);
            auVar194._0_2_ = auVar210._0_2_ + auVar133._0_2_ + 0x40;
            auVar194._2_2_ = auVar210._2_2_ + auVar133._2_2_ + 0x40;
            auVar194._4_2_ = auVar210._4_2_ + auVar133._4_2_ + 0x40;
            auVar194._6_2_ = auVar210._6_2_ + auVar133._6_2_ + 0x40;
            auVar194._8_2_ = auVar210._8_2_ + auVar133._8_2_ + 0x40;
            auVar194._10_2_ = auVar210._10_2_ + auVar133._10_2_ + 0x40;
            auVar194._12_2_ = auVar210._12_2_ + auVar133._12_2_ + 0x40;
            auVar194._14_2_ = auVar210._14_2_ + auVar133._14_2_ + 0x40;
            auVar161 = pshufb(auVar161,_DAT_0051d520);
            auVar161 = pmaddubsw(auVar82,auVar161);
            auVar83._0_2_ = auVar161._0_2_ + auVar209._0_2_;
            auVar83._2_2_ = auVar161._2_2_ + auVar209._2_2_;
            auVar83._4_2_ = auVar161._4_2_ + auVar209._4_2_;
            auVar83._6_2_ = auVar161._6_2_ + auVar209._6_2_;
            auVar83._8_2_ = auVar161._8_2_ + auVar209._8_2_;
            auVar83._10_2_ = auVar161._10_2_ + auVar209._10_2_;
            auVar83._12_2_ = auVar161._12_2_ + auVar209._12_2_;
            auVar83._14_2_ = auVar161._14_2_ + auVar209._14_2_;
            auVar161 = paddsw(auVar83,auVar194);
            auVar161 = psraw(auVar161,7);
            sVar5 = auVar161._0_2_;
            sVar6 = auVar161._2_2_;
            sVar7 = auVar161._4_2_;
            sVar8 = auVar161._6_2_;
            sVar9 = auVar161._8_2_;
            sVar10 = auVar161._10_2_;
            sVar11 = auVar161._12_2_;
            sVar12 = auVar161._14_2_;
            (&local_2438)[lVar63] =
                 CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar161[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar161[0xc] - (0xff < sVar11)
                                   ,CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar161[10] -
                                             (0xff < sVar10),
                                             CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar161[8] -
                                                      (0xff < sVar9),
                                                      CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar161[6] - (0xff < sVar8),
                                                               CONCAT12((0 < sVar7) *
                                                                        (sVar7 < 0x100) *
                                                                        auVar161[4] - (0xff < sVar7)
                                                                        ,CONCAT11((0 < sVar6) *
                                                                                  (sVar6 < 0x100) *
                                                                                  auVar161[2] -
                                                                                  (0xff < sVar6),
                                                                                  (0 < sVar5) *
                                                                                  (sVar5 < 0x100) *
                                                                                  auVar161[0] -
                                                                                  (0xff < sVar5)))))
                                            )));
          }
          uVar59 = uVar59 + x_step_q4;
          lVar63 = lVar63 + 1;
          puVar64 = puVar64 + 1;
        } while (lVar63 != 8);
        Var21 = CONCAT19(uStack_242f,CONCAT18(uStack_2430,local_2438));
        auVar22[10] = uStack_242e;
        auVar22._0_10_ = Var21;
        auVar23[0xb] = uStack_242d;
        auVar23._0_11_ = auVar22;
        auVar24[0xc] = uStack_242c;
        auVar24._0_12_ = auVar23;
        auVar91[0xd] = uStack_242b;
        auVar91._0_13_ = auVar24;
        auVar91[0xe] = (char)((ulong)local_2438 >> 0x38);
        auVar91[0xf] = uStack_2429;
        auVar90._14_2_ = auVar91._14_2_;
        auVar90[0xd] = uStack_242a;
        auVar90._0_13_ = auVar24;
        auVar89._13_3_ = auVar90._13_3_;
        auVar89[0xc] = (char)((ulong)local_2438 >> 0x30);
        auVar89._0_12_ = auVar23;
        auVar88._12_4_ = auVar89._12_4_;
        auVar88[0xb] = uStack_242b;
        auVar88._0_11_ = auVar22;
        auVar87._11_5_ = auVar88._11_5_;
        auVar87[10] = (char)((ulong)local_2438 >> 0x28);
        auVar87._0_10_ = Var21;
        auVar86._10_6_ = auVar87._10_6_;
        auVar86[9] = uStack_242c;
        auVar86._0_9_ = CONCAT18(uStack_2430,local_2438);
        auVar85._9_7_ = auVar86._9_7_;
        auVar85[8] = (char)((ulong)local_2438 >> 0x20);
        auVar85._0_8_ = local_2438;
        Var39 = CONCAT91(CONCAT81(auVar85._8_8_,uStack_242d),(char)((ulong)local_2438 >> 0x18));
        auVar38._2_10_ = Var39;
        auVar38[1] = uStack_242e;
        auVar38[0] = (char)((ulong)local_2438 >> 0x10);
        auVar37._2_12_ = auVar38;
        auVar37[1] = uStack_242f;
        auVar37[0] = (char)((ulong)local_2438 >> 8);
        auVar84._0_2_ = CONCAT11(uStack_2430,(char)local_2438);
        auVar84._2_14_ = auVar37;
        Var21 = CONCAT19(uStack_241f,CONCAT18(uStack_2420,local_2428));
        auVar26[10] = uStack_241e;
        auVar26._0_10_ = Var21;
        auVar27[0xb] = uStack_241d;
        auVar27._0_11_ = auVar26;
        auVar28[0xc] = uStack_241c;
        auVar28._0_12_ = auVar27;
        auVar110[0xd] = uStack_241b;
        auVar110._0_13_ = auVar28;
        auVar110[0xe] = (char)((ulong)local_2428 >> 0x38);
        auVar110[0xf] = uStack_2419;
        auVar109._14_2_ = auVar110._14_2_;
        auVar109[0xd] = uStack_241a;
        auVar109._0_13_ = auVar28;
        auVar108._13_3_ = auVar109._13_3_;
        auVar108[0xc] = (char)((ulong)local_2428 >> 0x30);
        auVar108._0_12_ = auVar27;
        auVar107._12_4_ = auVar108._12_4_;
        auVar107[0xb] = uStack_241b;
        auVar107._0_11_ = auVar26;
        auVar106._11_5_ = auVar107._11_5_;
        auVar106[10] = (char)((ulong)local_2428 >> 0x28);
        auVar106._0_10_ = Var21;
        auVar105._10_6_ = auVar106._10_6_;
        auVar105[9] = uStack_241c;
        auVar105._0_9_ = CONCAT18(uStack_2420,local_2428);
        auVar104._9_7_ = auVar105._9_7_;
        auVar104[8] = (char)((ulong)local_2428 >> 0x20);
        auVar104._0_8_ = local_2428;
        Var42 = CONCAT91(CONCAT81(auVar104._8_8_,uStack_241d),(char)((ulong)local_2428 >> 0x18));
        auVar41._2_10_ = Var42;
        auVar41[1] = uStack_241e;
        auVar41[0] = (char)((ulong)local_2428 >> 0x10);
        auVar40._2_12_ = auVar41;
        auVar40[1] = uStack_241f;
        auVar40[0] = (char)((ulong)local_2428 >> 8);
        Var21 = CONCAT19(uStack_240f,CONCAT18(uStack_2410,local_2418));
        auVar29[10] = uStack_240e;
        auVar29._0_10_ = Var21;
        auVar30[0xb] = uStack_240d;
        auVar30._0_11_ = auVar29;
        auVar31[0xc] = uStack_240c;
        auVar31._0_12_ = auVar30;
        auVar141[0xd] = uStack_240b;
        auVar141._0_13_ = auVar31;
        auVar141[0xe] = (char)((ulong)local_2418 >> 0x38);
        auVar141[0xf] = uStack_2409;
        auVar140._14_2_ = auVar141._14_2_;
        auVar140[0xd] = uStack_240a;
        auVar140._0_13_ = auVar31;
        auVar139._13_3_ = auVar140._13_3_;
        auVar139[0xc] = (char)((ulong)local_2418 >> 0x30);
        auVar139._0_12_ = auVar30;
        auVar138._12_4_ = auVar139._12_4_;
        auVar138[0xb] = uStack_240b;
        auVar138._0_11_ = auVar29;
        auVar137._11_5_ = auVar138._11_5_;
        auVar137[10] = (char)((ulong)local_2418 >> 0x28);
        auVar137._0_10_ = Var21;
        auVar136._10_6_ = auVar137._10_6_;
        auVar136[9] = uStack_240c;
        auVar136._0_9_ = CONCAT18(uStack_2410,local_2418);
        auVar135._9_7_ = auVar136._9_7_;
        auVar135[8] = (char)((ulong)local_2418 >> 0x20);
        auVar135._0_8_ = local_2418;
        Var21 = CONCAT91(CONCAT81(auVar135._8_8_,uStack_240d),(char)((ulong)local_2418 >> 0x18));
        auVar44._2_10_ = Var21;
        auVar44[1] = uStack_240e;
        auVar44[0] = (char)((ulong)local_2418 >> 0x10);
        auVar43._2_12_ = auVar44;
        auVar43[1] = uStack_240f;
        auVar43[0] = (char)((ulong)local_2418 >> 8);
        auVar134._0_2_ = CONCAT11(uStack_2410,(char)local_2418);
        auVar134._2_14_ = auVar43;
        auVar32._8_8_ = uStack_2400;
        auVar32._0_8_ = local_2408;
        auVar168._0_14_ = auVar32._0_14_;
        auVar168[0xe] = (char)((ulong)local_2408 >> 0x38);
        auVar168[0xf] = (char)((ulong)uStack_2400 >> 0x38);
        auVar167._14_2_ = auVar168._14_2_;
        auVar167._0_13_ = auVar32._0_13_;
        auVar167[0xd] = (char)((ulong)uStack_2400 >> 0x30);
        auVar166._13_3_ = auVar167._13_3_;
        auVar166._0_12_ = auVar32._0_12_;
        auVar166[0xc] = (char)((ulong)local_2408 >> 0x30);
        auVar165._12_4_ = auVar166._12_4_;
        auVar165._0_11_ = auVar32._0_11_;
        auVar165[0xb] = (char)((ulong)uStack_2400 >> 0x28);
        auVar164._11_5_ = auVar165._11_5_;
        auVar164._0_10_ = auVar32._0_10_;
        auVar164[10] = (char)((ulong)local_2408 >> 0x28);
        auVar163._10_6_ = auVar164._10_6_;
        auVar163._0_9_ = auVar32._0_9_;
        auVar163[9] = (char)((ulong)uStack_2400 >> 0x20);
        auVar162._9_7_ = auVar163._9_7_;
        auVar162[8] = (char)((ulong)local_2408 >> 0x20);
        auVar162._0_8_ = local_2408;
        Var47 = CONCAT91(CONCAT81(auVar162._8_8_,(char)((ulong)uStack_2400 >> 0x18)),
                         (char)((ulong)local_2408 >> 0x18));
        auVar46._2_10_ = Var47;
        auVar46[1] = (char)((ulong)uStack_2400 >> 0x10);
        auVar46[0] = (char)((ulong)local_2408 >> 0x10);
        auVar45._2_12_ = auVar46;
        auVar45[1] = (char)((ulong)uStack_2400 >> 8);
        auVar45[0] = (char)((ulong)local_2408 >> 8);
        auVar197._0_12_ = auVar84._0_12_;
        auVar197._12_2_ = (short)Var39;
        auVar197._14_2_ = (short)Var42;
        auVar196._12_4_ = auVar197._12_4_;
        auVar196._0_10_ = auVar84._0_10_;
        auVar196._10_2_ = auVar41._0_2_;
        auVar195._10_6_ = auVar196._10_6_;
        auVar195._0_8_ = auVar84._0_8_;
        auVar195._8_2_ = auVar38._0_2_;
        auVar48._4_8_ = auVar195._8_8_;
        auVar48._2_2_ = auVar40._0_2_;
        auVar48._0_2_ = auVar37._0_2_;
        uVar75 = CONCAT22(auVar104._8_2_,auVar85._8_2_);
        auVar76._0_8_ = CONCAT26(auVar106._10_2_,CONCAT24(auVar87._10_2_,uVar75));
        auVar76._8_2_ = auVar89._12_2_;
        auVar76._10_2_ = auVar108._12_2_;
        auVar92._12_2_ = auVar90._14_2_;
        auVar92._0_12_ = auVar76;
        auVar92._14_2_ = auVar109._14_2_;
        auVar113._0_12_ = auVar134._0_12_;
        auVar113._12_2_ = (short)Var21;
        auVar113._14_2_ = (short)Var47;
        auVar112._12_4_ = auVar113._12_4_;
        auVar112._0_10_ = auVar134._0_10_;
        auVar112._10_2_ = auVar46._0_2_;
        auVar111._10_6_ = auVar112._10_6_;
        auVar111._0_8_ = auVar134._0_8_;
        auVar111._8_2_ = auVar44._0_2_;
        auVar49._4_8_ = auVar111._8_8_;
        auVar49._2_2_ = auVar45._0_2_;
        auVar49._0_2_ = auVar43._0_2_;
        uVar126 = CONCAT22(auVar162._8_2_,auVar135._8_2_);
        auVar128._0_8_ = CONCAT26(auVar164._10_2_,CONCAT24(auVar137._10_2_,uVar126));
        auVar128._8_2_ = auVar139._12_2_;
        auVar128._10_2_ = auVar166._12_2_;
        auVar142._12_2_ = auVar140._14_2_;
        auVar142._0_12_ = auVar128;
        auVar142._14_2_ = auVar167._14_2_;
        *(ulong *)((long)puVar55 + uVar65) =
             CONCAT44(CONCAT22(CONCAT11((char)uStack_2400,(char)local_2408),auVar134._0_2_),
                      CONCAT22(CONCAT11(uStack_2420,(char)local_2428),auVar84._0_2_));
        *(ulong *)((long)puVar55 + uVar65 + 0x40) = CONCAT44(auVar49._0_4_,auVar48._0_4_);
        *(ulong *)((long)puVar55 + uVar65 + 0x80) = CONCAT44(auVar111._8_4_,auVar195._8_4_);
        uVar127 = CONCAT44(auVar112._12_4_,auVar196._12_4_);
        *(undefined8 *)((long)puVar55 + uVar65 + 0xc0) = uVar127;
        *(ulong *)((long)puVar55 + uVar65 + 0x100) = CONCAT44(uVar126,uVar75);
        *(ulong *)((long)puVar55 + uVar65 + 0x140) =
             CONCAT44((int)((ulong)auVar128._0_8_ >> 0x20),(int)((ulong)auVar76._0_8_ >> 0x20));
        *(ulong *)((long)puVar55 + uVar65 + 0x180) = CONCAT44(auVar128._8_4_,auVar76._8_4_);
        *(ulong *)((long)puVar55 + uVar65 + 0x1c0) = CONCAT44(auVar142._12_4_,auVar92._12_4_);
        uVar65 = uVar65 + 8;
      } while (uVar65 < (uint)w);
      puVar60 = puVar60 + src_stride * 8;
      puVar55 = puVar55 + 0x40;
      puVar56 = puVar56 + src_stride * 8;
      iVar52 = iVar52 + -8;
    } while (iVar52 != 0);
  }
  if (w < 0x10) {
    if (w == 8) {
      if (0 < h) {
        uVar65 = (ulong)(uint)h;
        do {
          lVar63 = (long)(y0_q4 >> 4);
          if ((y0_q4 & 0xfU) == 0) {
            *(undefined8 *)dst = (&uStack_2338)[lVar63 * 8];
          }
          else {
            uVar53 = local_23f8[lVar63 * 8];
            uVar127 = (&uStack_23b8)[lVar63 * 8];
            auVar155._8_6_ = 0;
            auVar155._0_8_ = uVar53;
            auVar155[0xe] = (char)(uVar53 >> 0x38);
            auVar155[0xf] = (char)((ulong)uVar127 >> 0x38);
            auVar154._14_2_ = auVar155._14_2_;
            auVar154._8_5_ = 0;
            auVar154._0_8_ = uVar53;
            auVar154[0xd] = (char)((ulong)uVar127 >> 0x30);
            auVar153._13_3_ = auVar154._13_3_;
            auVar153._8_4_ = 0;
            auVar153._0_8_ = uVar53;
            auVar153[0xc] = (char)(uVar53 >> 0x30);
            auVar152._12_4_ = auVar153._12_4_;
            auVar152._8_3_ = 0;
            auVar152._0_8_ = uVar53;
            auVar152[0xb] = (char)((ulong)uVar127 >> 0x28);
            auVar151._11_5_ = auVar152._11_5_;
            auVar151._8_2_ = 0;
            auVar151._0_8_ = uVar53;
            auVar151[10] = (char)(uVar53 >> 0x28);
            auVar150._10_6_ = auVar151._10_6_;
            auVar150[8] = 0;
            auVar150._0_8_ = uVar53;
            auVar150[9] = (char)((ulong)uVar127 >> 0x20);
            auVar149._9_7_ = auVar150._9_7_;
            auVar149[8] = (char)(uVar53 >> 0x20);
            auVar149._0_8_ = uVar53;
            auVar148._8_8_ = auVar149._8_8_;
            auVar148[7] = (char)((ulong)uVar127 >> 0x18);
            auVar148[6] = (char)(uVar53 >> 0x18);
            auVar148[5] = (char)((ulong)uVar127 >> 0x10);
            auVar148[4] = (char)(uVar53 >> 0x10);
            auVar148[3] = (char)((ulong)uVar127 >> 8);
            auVar148[2] = (char)(uVar53 >> 8);
            auVar148[0] = (undefined1)uVar53;
            auVar148[1] = (char)uVar127;
            uVar53 = auStack_2378[lVar63 * 8];
            uVar127 = (&uStack_2338)[lVar63 * 8];
            auVar101._8_6_ = 0;
            auVar101._0_8_ = uVar53;
            auVar101[0xe] = (char)(uVar53 >> 0x38);
            auVar101[0xf] = (char)((ulong)uVar127 >> 0x38);
            auVar100._14_2_ = auVar101._14_2_;
            auVar100._8_5_ = 0;
            auVar100._0_8_ = uVar53;
            auVar100[0xd] = (char)((ulong)uVar127 >> 0x30);
            auVar99._13_3_ = auVar100._13_3_;
            auVar99._8_4_ = 0;
            auVar99._0_8_ = uVar53;
            auVar99[0xc] = (char)(uVar53 >> 0x30);
            auVar98._12_4_ = auVar99._12_4_;
            auVar98._8_3_ = 0;
            auVar98._0_8_ = uVar53;
            auVar98[0xb] = (char)((ulong)uVar127 >> 0x28);
            auVar97._11_5_ = auVar98._11_5_;
            auVar97._8_2_ = 0;
            auVar97._0_8_ = uVar53;
            auVar97[10] = (char)(uVar53 >> 0x28);
            auVar96._10_6_ = auVar97._10_6_;
            auVar96[8] = 0;
            auVar96._0_8_ = uVar53;
            auVar96[9] = (char)((ulong)uVar127 >> 0x20);
            auVar95._9_7_ = auVar96._9_7_;
            auVar95[8] = (char)(uVar53 >> 0x20);
            auVar95._0_8_ = uVar53;
            auVar94._8_8_ = auVar95._8_8_;
            auVar94[7] = (char)((ulong)uVar127 >> 0x18);
            auVar94[6] = (char)(uVar53 >> 0x18);
            auVar94[5] = (char)((ulong)uVar127 >> 0x10);
            auVar94[4] = (char)(uVar53 >> 0x10);
            auVar94[3] = (char)((ulong)uVar127 >> 8);
            auVar94[2] = (char)(uVar53 >> 8);
            auVar94[0] = (undefined1)uVar53;
            auVar94[1] = (char)uVar127;
            uVar53 = auStack_22f8[lVar63 * 8];
            uVar127 = (&uStack_22b8)[lVar63 * 8];
            auVar188._8_6_ = 0;
            auVar188._0_8_ = uVar53;
            auVar188[0xe] = (char)(uVar53 >> 0x38);
            auVar188[0xf] = (char)((ulong)uVar127 >> 0x38);
            auVar187._14_2_ = auVar188._14_2_;
            auVar187._8_5_ = 0;
            auVar187._0_8_ = uVar53;
            auVar187[0xd] = (char)((ulong)uVar127 >> 0x30);
            auVar186._13_3_ = auVar187._13_3_;
            auVar186._8_4_ = 0;
            auVar186._0_8_ = uVar53;
            auVar186[0xc] = (char)(uVar53 >> 0x30);
            auVar185._12_4_ = auVar186._12_4_;
            auVar185._8_3_ = 0;
            auVar185._0_8_ = uVar53;
            auVar185[0xb] = (char)((ulong)uVar127 >> 0x28);
            auVar184._11_5_ = auVar185._11_5_;
            auVar184._8_2_ = 0;
            auVar184._0_8_ = uVar53;
            auVar184[10] = (char)(uVar53 >> 0x28);
            auVar183._10_6_ = auVar184._10_6_;
            auVar183[8] = 0;
            auVar183._0_8_ = uVar53;
            auVar183[9] = (char)((ulong)uVar127 >> 0x20);
            auVar182._9_7_ = auVar183._9_7_;
            auVar182[8] = (char)(uVar53 >> 0x20);
            auVar182._0_8_ = uVar53;
            auVar181._8_8_ = auVar182._8_8_;
            auVar181[7] = (char)((ulong)uVar127 >> 0x18);
            auVar181[6] = (char)(uVar53 >> 0x18);
            auVar181[5] = (char)((ulong)uVar127 >> 0x10);
            auVar181[4] = (char)(uVar53 >> 0x10);
            auVar181[3] = (char)((ulong)uVar127 >> 8);
            auVar181[2] = (char)(uVar53 >> 8);
            auVar181[0] = (undefined1)uVar53;
            auVar181[1] = (char)uVar127;
            uVar53 = auStack_2278[lVar63 * 8];
            uVar127 = (&uStack_2238)[lVar63 * 8];
            auVar124._8_6_ = 0;
            auVar124._0_8_ = uVar53;
            auVar124[0xe] = (char)(uVar53 >> 0x38);
            auVar124[0xf] = (char)((ulong)uVar127 >> 0x38);
            auVar123._14_2_ = auVar124._14_2_;
            auVar123._8_5_ = 0;
            auVar123._0_8_ = uVar53;
            auVar123[0xd] = (char)((ulong)uVar127 >> 0x30);
            auVar122._13_3_ = auVar123._13_3_;
            auVar122._8_4_ = 0;
            auVar122._0_8_ = uVar53;
            auVar122[0xc] = (char)(uVar53 >> 0x30);
            auVar121._12_4_ = auVar122._12_4_;
            auVar121._8_3_ = 0;
            auVar121._0_8_ = uVar53;
            auVar121[0xb] = (char)((ulong)uVar127 >> 0x28);
            auVar120._11_5_ = auVar121._11_5_;
            auVar120._8_2_ = 0;
            auVar120._0_8_ = uVar53;
            auVar120[10] = (char)(uVar53 >> 0x28);
            auVar119._10_6_ = auVar120._10_6_;
            auVar119[8] = 0;
            auVar119._0_8_ = uVar53;
            auVar119[9] = (char)((ulong)uVar127 >> 0x20);
            auVar118._9_7_ = auVar119._9_7_;
            auVar118[8] = (char)(uVar53 >> 0x20);
            auVar118._0_8_ = uVar53;
            auVar117._8_8_ = auVar118._8_8_;
            auVar117[7] = (char)((ulong)uVar127 >> 0x18);
            auVar117[6] = (char)(uVar53 >> 0x18);
            auVar117[5] = (char)((ulong)uVar127 >> 0x10);
            auVar117[4] = (char)(uVar53 >> 0x10);
            auVar117[3] = (char)((ulong)uVar127 >> 8);
            auVar117[2] = (char)(uVar53 >> 8);
            auVar117[0] = (undefined1)uVar53;
            auVar117[1] = (char)uVar127;
            auVar161 = *(undefined1 (*) [16])((long)*filter + (ulong)((y0_q4 & 0xfU) << 4));
            auVar209 = pshufb(auVar161,auVar66);
            auVar133 = pmaddubsw(auVar148,auVar209);
            auVar209 = pshufb(auVar161,auVar68);
            auVar209 = pmaddubsw(auVar94,auVar209);
            auVar210 = pshufb(auVar161,auVar67);
            auVar210 = pmaddubsw(auVar181,auVar210);
            auVar189._0_2_ = auVar210._0_2_ + auVar133._0_2_ + 0x40;
            auVar189._2_2_ = auVar210._2_2_ + auVar133._2_2_ + 0x40;
            auVar189._4_2_ = auVar210._4_2_ + auVar133._4_2_ + 0x40;
            auVar189._6_2_ = auVar210._6_2_ + auVar133._6_2_ + 0x40;
            auVar189._8_2_ = auVar210._8_2_ + auVar133._8_2_ + 0x40;
            auVar189._10_2_ = auVar210._10_2_ + auVar133._10_2_ + 0x40;
            auVar189._12_2_ = auVar210._12_2_ + auVar133._12_2_ + 0x40;
            auVar189._14_2_ = auVar210._14_2_ + auVar133._14_2_ + 0x40;
            auVar161 = pshufb(auVar161,auVar70);
            auVar161 = pmaddubsw(auVar117,auVar161);
            auVar125._0_2_ = auVar161._0_2_ + auVar209._0_2_;
            auVar125._2_2_ = auVar161._2_2_ + auVar209._2_2_;
            auVar125._4_2_ = auVar161._4_2_ + auVar209._4_2_;
            auVar125._6_2_ = auVar161._6_2_ + auVar209._6_2_;
            auVar125._8_2_ = auVar161._8_2_ + auVar209._8_2_;
            auVar125._10_2_ = auVar161._10_2_ + auVar209._10_2_;
            auVar125._12_2_ = auVar161._12_2_ + auVar209._12_2_;
            auVar125._14_2_ = auVar161._14_2_ + auVar209._14_2_;
            auVar161 = paddsw(auVar125,auVar189);
            auVar161 = psraw(auVar161,7);
            sVar5 = auVar161._0_2_;
            sVar6 = auVar161._2_2_;
            sVar7 = auVar161._4_2_;
            sVar8 = auVar161._6_2_;
            sVar9 = auVar161._8_2_;
            sVar10 = auVar161._10_2_;
            sVar11 = auVar161._12_2_;
            sVar12 = auVar161._14_2_;
            *(ulong *)dst =
                 CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar161[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar161[0xc] - (0xff < sVar11)
                                   ,CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar161[10] -
                                             (0xff < sVar10),
                                             CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar161[8] -
                                                      (0xff < sVar9),
                                                      CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar161[6] - (0xff < sVar8),
                                                               CONCAT12((0 < sVar7) *
                                                                        (sVar7 < 0x100) *
                                                                        auVar161[4] - (0xff < sVar7)
                                                                        ,CONCAT11((0 < sVar6) *
                                                                                  (sVar6 < 0x100) *
                                                                                  auVar161[2] -
                                                                                  (0xff < sVar6),
                                                                                  (0 < sVar5) *
                                                                                  (sVar5 < 0x100) *
                                                                                  auVar161[0] -
                                                                                  (0xff < sVar5)))))
                                            )));
          }
          y0_q4 = y0_q4 + y_step_q4;
          dst = dst + dst_stride;
          uVar65 = uVar65 - 1;
        } while (uVar65 != 0);
      }
    }
    else if (0 < h) {
      uVar65 = (ulong)(uint)h;
      do {
        lVar63 = (long)(y0_q4 >> 4);
        if ((y0_q4 & 0xfU) == 0) {
          memcpy(dst,&uStack_2338 + lVar63 * 8,(long)w);
        }
        else {
          uVar75 = (undefined4)local_23f8[lVar63 * 8];
          uVar126 = *(undefined4 *)(&uStack_23b8 + lVar63 * 8);
          auVar69._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar126 >> 0x18),
                                                (char)((uint)uVar75 >> 0x18)),
                                       (char)((uint)uVar126 >> 0x10)),
                              CONCAT14((char)((uint)uVar75 >> 0x10),uVar75)) >> 0x20);
          auVar69[3] = (char)((uint)uVar126 >> 8);
          auVar69[2] = (char)((uint)uVar75 >> 8);
          auVar69[0] = (undefined1)uVar75;
          auVar69[1] = (char)uVar126;
          auVar69._8_8_ = 0;
          uVar75 = (undefined4)auStack_2378[lVar63 * 8];
          uVar126 = *(undefined4 *)(&uStack_2338 + lVar63 * 8);
          auVar67._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar126 >> 0x18),
                                                (char)((uint)uVar75 >> 0x18)),
                                       (char)((uint)uVar126 >> 0x10)),
                              CONCAT14((char)((uint)uVar75 >> 0x10),uVar75)) >> 0x20);
          auVar67[3] = (char)((uint)uVar126 >> 8);
          auVar67[2] = (char)((uint)uVar75 >> 8);
          auVar67[0] = (undefined1)uVar75;
          auVar67[1] = (char)uVar126;
          auVar67._8_8_ = 0;
          uVar75 = (undefined4)auStack_22f8[lVar63 * 8];
          uVar126 = *(undefined4 *)(&uStack_22b8 + lVar63 * 8);
          auVar71._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar126 >> 0x18),
                                                (char)((uint)uVar75 >> 0x18)),
                                       (char)((uint)uVar126 >> 0x10)),
                              CONCAT14((char)((uint)uVar75 >> 0x10),uVar75)) >> 0x20);
          auVar71[3] = (char)((uint)uVar126 >> 8);
          auVar71[2] = (char)((uint)uVar75 >> 8);
          auVar71[0] = (undefined1)uVar75;
          auVar71[1] = (char)uVar126;
          auVar71._8_8_ = 0;
          uVar75 = (undefined4)auStack_2278[lVar63 * 8];
          uVar126 = *(undefined4 *)(&uStack_2238 + lVar63 * 8);
          auVar68._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar126 >> 0x18),
                                                (char)((uint)uVar75 >> 0x18)),
                                       (char)((uint)uVar126 >> 0x10)),
                              CONCAT14((char)((uint)uVar75 >> 0x10),uVar75)) >> 0x20);
          auVar68[3] = (char)((uint)uVar126 >> 8);
          auVar68[2] = (char)((uint)uVar75 >> 8);
          auVar68[0] = (undefined1)uVar75;
          auVar68[1] = (char)uVar126;
          auVar68._8_8_ = 0;
          auVar66 = *(undefined1 (*) [16])((long)*filter + (ulong)((y0_q4 & 0xfU) << 4));
          auVar70 = pshufb(auVar66,_DAT_0051d4c0);
          auVar70 = pmaddubsw(auVar69,auVar70);
          auVar161 = pshufb(auVar66,_DAT_0051d510);
          auVar67 = pmaddubsw(auVar67,auVar161);
          auVar161 = pshufb(auVar66,_DAT_0051d4e0);
          auVar161 = pmaddubsw(auVar71,auVar161);
          auVar72._0_2_ = auVar161._0_2_ + auVar70._0_2_ + 0x40;
          auVar72._2_2_ = auVar161._2_2_ + auVar70._2_2_ + 0x40;
          auVar72._4_2_ = auVar161._4_2_ + auVar70._4_2_ + 0x40;
          auVar72._6_2_ = auVar161._6_2_ + auVar70._6_2_ + 0x40;
          auVar72._8_2_ = auVar161._8_2_ + auVar70._8_2_ + 0x40;
          auVar72._10_2_ = auVar161._10_2_ + auVar70._10_2_ + 0x40;
          auVar72._12_2_ = auVar161._12_2_ + auVar70._12_2_ + 0x40;
          auVar72._14_2_ = auVar161._14_2_ + auVar70._14_2_ + 0x40;
          auVar66 = pshufb(auVar66,_DAT_0051d520);
          auVar66 = pmaddubsw(auVar68,auVar66);
          auVar70._0_2_ = auVar66._0_2_ + auVar67._0_2_;
          auVar70._2_2_ = auVar66._2_2_ + auVar67._2_2_;
          auVar70._4_2_ = auVar66._4_2_ + auVar67._4_2_;
          auVar70._6_2_ = auVar66._6_2_ + auVar67._6_2_;
          auVar70._8_2_ = auVar66._8_2_ + auVar67._8_2_;
          auVar70._10_2_ = auVar66._10_2_ + auVar67._10_2_;
          auVar70._12_2_ = auVar66._12_2_ + auVar67._12_2_;
          auVar70._14_2_ = auVar66._14_2_ + auVar67._14_2_;
          auVar66 = paddsw(auVar70,auVar72);
          auVar66 = psraw(auVar66,7);
          sVar5 = auVar66._0_2_;
          sVar6 = auVar66._2_2_;
          sVar7 = auVar66._4_2_;
          sVar8 = auVar66._6_2_;
          *(uint *)dst = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar66[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar66[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar66[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar66[0] -
                                                    (0xff < sVar5))));
        }
        y0_q4 = y0_q4 + y_step_q4;
        dst = dst + dst_stride;
        uVar65 = uVar65 - 1;
      } while (uVar65 != 0);
    }
  }
  else if (0 < h) {
    uVar65 = 0;
    puVar60 = dst;
    do {
      lVar63 = (long)(y0_q4 >> 4) * 0x40;
      if ((y0_q4 & 0xfU) == 0) {
        memcpy(dst + uVar65 * dst_stride,&uStack_2338 + (long)(y0_q4 >> 4) * 8,(ulong)(uint)w);
      }
      else {
        auVar66 = *(undefined1 (*) [16])((long)*filter + (ulong)((y0_q4 & 0xfU) << 4));
        auVar67 = pshufb(auVar66,_DAT_0051d4c0);
        auVar68 = pshufb(auVar66,_DAT_0051d510);
        auVar70 = pshufb(auVar66,_DAT_0051d4e0);
        auVar66 = pshufb(auVar66,_DAT_0051d520);
        uVar53 = 0;
        do {
          auVar161 = *(undefined1 (*) [16])((long)local_23f8 + uVar53 + lVar63);
          puVar1 = (undefined1 *)((long)&uStack_23b8 + uVar53 + lVar63);
          auVar209 = *(undefined1 (*) [16])((long)auStack_2378 + uVar53 + lVar63);
          puVar2 = (undefined1 *)((long)&uStack_2338 + uVar53 + lVar63);
          auVar133 = *(undefined1 (*) [16])((long)auStack_22f8 + uVar53 + lVar63);
          puVar3 = (undefined1 *)((long)&uStack_22b8 + uVar53 + lVar63);
          auVar210 = *(undefined1 (*) [16])((long)auStack_2278 + uVar53 + lVar63);
          puVar4 = (undefined1 *)((long)&uStack_2238 + uVar53 + lVar63);
          auVar218._0_14_ = auVar161._0_14_;
          auVar218[0xe] = auVar161[7];
          auVar218[0xf] = puVar1[7];
          auVar217._14_2_ = auVar218._14_2_;
          auVar217._0_13_ = auVar161._0_13_;
          auVar217[0xd] = puVar1[6];
          auVar216._13_3_ = auVar217._13_3_;
          auVar216._0_12_ = auVar161._0_12_;
          auVar216[0xc] = auVar161[6];
          auVar215._12_4_ = auVar216._12_4_;
          auVar215._0_11_ = auVar161._0_11_;
          auVar215[0xb] = puVar1[5];
          auVar214._11_5_ = auVar215._11_5_;
          auVar214._0_10_ = auVar161._0_10_;
          auVar214[10] = auVar161[5];
          auVar213._10_6_ = auVar214._10_6_;
          auVar213._0_9_ = auVar161._0_9_;
          auVar213[9] = puVar1[4];
          auVar212._9_7_ = auVar213._9_7_;
          auVar212._0_8_ = auVar161._0_8_;
          auVar212[8] = auVar161[4];
          auVar211._8_8_ = auVar212._8_8_;
          auVar211[7] = puVar1[3];
          auVar211[6] = auVar161[3];
          auVar211[5] = puVar1[2];
          auVar211[4] = auVar161[2];
          auVar211[3] = puVar1[1];
          auVar211[2] = auVar161[1];
          auVar211[0] = auVar161[0];
          auVar211[1] = *puVar1;
          auVar147[1] = puVar1[8];
          auVar147[0] = auVar161[8];
          auVar147[2] = auVar161[9];
          auVar147[3] = puVar1[9];
          auVar147[4] = auVar161[10];
          auVar147[5] = puVar1[10];
          auVar147[6] = auVar161[0xb];
          auVar147[7] = puVar1[0xb];
          auVar147[8] = auVar161[0xc];
          auVar147[9] = puVar1[0xc];
          auVar147[10] = auVar161[0xd];
          auVar147[0xb] = puVar1[0xd];
          auVar147[0xc] = auVar161[0xe];
          auVar147[0xd] = puVar1[0xe];
          auVar147[0xe] = auVar161[0xf];
          auVar147[0xf] = puVar1[0xf];
          auVar226._0_14_ = auVar209._0_14_;
          auVar226[0xe] = auVar209[7];
          auVar226[0xf] = puVar2[7];
          auVar225._14_2_ = auVar226._14_2_;
          auVar225._0_13_ = auVar209._0_13_;
          auVar225[0xd] = puVar2[6];
          auVar224._13_3_ = auVar225._13_3_;
          auVar224._0_12_ = auVar209._0_12_;
          auVar224[0xc] = auVar209[6];
          auVar223._12_4_ = auVar224._12_4_;
          auVar223._0_11_ = auVar209._0_11_;
          auVar223[0xb] = puVar2[5];
          auVar222._11_5_ = auVar223._11_5_;
          auVar222._0_10_ = auVar209._0_10_;
          auVar222[10] = auVar209[5];
          auVar221._10_6_ = auVar222._10_6_;
          auVar221._0_9_ = auVar209._0_9_;
          auVar221[9] = puVar2[4];
          auVar220._9_7_ = auVar221._9_7_;
          auVar220._0_8_ = auVar209._0_8_;
          auVar220[8] = auVar209[4];
          auVar219._8_8_ = auVar220._8_8_;
          auVar219[7] = puVar2[3];
          auVar219[6] = auVar209[3];
          auVar219[5] = puVar2[2];
          auVar219[4] = auVar209[2];
          auVar219[3] = puVar2[1];
          auVar219[2] = auVar209[1];
          auVar219[0] = auVar209[0];
          auVar219[1] = *puVar2;
          auVar93[1] = puVar2[8];
          auVar93[0] = auVar209[8];
          auVar93[2] = auVar209[9];
          auVar93[3] = puVar2[9];
          auVar93[4] = auVar209[10];
          auVar93[5] = puVar2[10];
          auVar93[6] = auVar209[0xb];
          auVar93[7] = puVar2[0xb];
          auVar93[8] = auVar209[0xc];
          auVar93[9] = puVar2[0xc];
          auVar93[10] = auVar209[0xd];
          auVar93[0xb] = puVar2[0xd];
          auVar93[0xc] = auVar209[0xe];
          auVar93[0xd] = puVar2[0xe];
          auVar93[0xe] = auVar209[0xf];
          auVar93[0xf] = puVar2[0xf];
          auVar178._0_14_ = auVar133._0_14_;
          auVar178[0xe] = auVar133[7];
          auVar178[0xf] = puVar3[7];
          auVar177._14_2_ = auVar178._14_2_;
          auVar177._0_13_ = auVar133._0_13_;
          auVar177[0xd] = puVar3[6];
          auVar176._13_3_ = auVar177._13_3_;
          auVar176._0_12_ = auVar133._0_12_;
          auVar176[0xc] = auVar133[6];
          auVar175._12_4_ = auVar176._12_4_;
          auVar175._0_11_ = auVar133._0_11_;
          auVar175[0xb] = puVar3[5];
          auVar174._11_5_ = auVar175._11_5_;
          auVar174._0_10_ = auVar133._0_10_;
          auVar174[10] = auVar133[5];
          auVar173._10_6_ = auVar174._10_6_;
          auVar173._0_9_ = auVar133._0_9_;
          auVar173[9] = puVar3[4];
          auVar172._9_7_ = auVar173._9_7_;
          auVar172._0_8_ = auVar133._0_8_;
          auVar172[8] = auVar133[4];
          auVar171._8_8_ = auVar172._8_8_;
          auVar171[7] = puVar3[3];
          auVar171[6] = auVar133[3];
          auVar171[5] = puVar3[2];
          auVar171[4] = auVar133[2];
          auVar171[3] = puVar3[1];
          auVar171[2] = auVar133[1];
          auVar171[0] = auVar133[0];
          auVar171[1] = *puVar3;
          auVar73[1] = puVar3[8];
          auVar73[0] = auVar133[8];
          auVar73[2] = auVar133[9];
          auVar73[3] = puVar3[9];
          auVar73[4] = auVar133[10];
          auVar73[5] = puVar3[10];
          auVar73[6] = auVar133[0xb];
          auVar73[7] = puVar3[0xb];
          auVar73[8] = auVar133[0xc];
          auVar73[9] = puVar3[0xc];
          auVar73[10] = auVar133[0xd];
          auVar73[0xb] = puVar3[0xd];
          auVar73[0xc] = auVar133[0xe];
          auVar73[0xd] = puVar3[0xe];
          auVar73[0xe] = auVar133[0xf];
          auVar73[0xf] = puVar3[0xf];
          auVar206._0_14_ = auVar210._0_14_;
          auVar206[0xe] = auVar210[7];
          auVar206[0xf] = puVar4[7];
          auVar205._14_2_ = auVar206._14_2_;
          auVar205._0_13_ = auVar210._0_13_;
          auVar205[0xd] = puVar4[6];
          auVar204._13_3_ = auVar205._13_3_;
          auVar204._0_12_ = auVar210._0_12_;
          auVar204[0xc] = auVar210[6];
          auVar203._12_4_ = auVar204._12_4_;
          auVar203._0_11_ = auVar210._0_11_;
          auVar203[0xb] = puVar4[5];
          auVar202._11_5_ = auVar203._11_5_;
          auVar202._0_10_ = auVar210._0_10_;
          auVar202[10] = auVar210[5];
          auVar201._10_6_ = auVar202._10_6_;
          auVar201._0_9_ = auVar210._0_9_;
          auVar201[9] = puVar4[4];
          auVar200._9_7_ = auVar201._9_7_;
          auVar200._0_8_ = auVar210._0_8_;
          auVar200[8] = auVar210[4];
          auVar199._8_8_ = auVar200._8_8_;
          auVar199[7] = puVar4[3];
          auVar199[6] = auVar210[3];
          auVar199[5] = puVar4[2];
          auVar199[4] = auVar210[2];
          auVar199[3] = puVar4[1];
          auVar199[2] = auVar210[1];
          auVar199[0] = auVar210[0];
          auVar199[1] = *puVar4;
          auVar115[1] = puVar4[8];
          auVar115[0] = auVar210[8];
          auVar115[2] = auVar210[9];
          auVar115[3] = puVar4[9];
          auVar115[4] = auVar210[10];
          auVar115[5] = puVar4[10];
          auVar115[6] = auVar210[0xb];
          auVar115[7] = puVar4[0xb];
          auVar115[8] = auVar210[0xc];
          auVar115[9] = puVar4[0xc];
          auVar115[10] = auVar210[0xd];
          auVar115[0xb] = puVar4[0xd];
          auVar115[0xc] = auVar210[0xe];
          auVar115[0xd] = puVar4[0xe];
          auVar115[0xe] = auVar210[0xf];
          auVar115[0xf] = puVar4[0xf];
          auVar133 = pmaddubsw(auVar211,auVar67);
          auVar210 = pmaddubsw(auVar219,auVar68);
          auVar161 = pmaddubsw(auVar171,auVar70);
          auVar209 = pmaddubsw(auVar199,auVar66);
          auVar207._0_2_ = auVar209._0_2_ + auVar210._0_2_;
          auVar207._2_2_ = auVar209._2_2_ + auVar210._2_2_;
          auVar207._4_2_ = auVar209._4_2_ + auVar210._4_2_;
          auVar207._6_2_ = auVar209._6_2_ + auVar210._6_2_;
          auVar207._8_2_ = auVar209._8_2_ + auVar210._8_2_;
          auVar207._10_2_ = auVar209._10_2_ + auVar210._10_2_;
          auVar207._12_2_ = auVar209._12_2_ + auVar210._12_2_;
          auVar207._14_2_ = auVar209._14_2_ + auVar210._14_2_;
          auVar179._0_2_ = auVar161._0_2_ + auVar133._0_2_ + 0x40;
          auVar179._2_2_ = auVar161._2_2_ + auVar133._2_2_ + 0x40;
          auVar179._4_2_ = auVar161._4_2_ + auVar133._4_2_ + 0x40;
          auVar179._6_2_ = auVar161._6_2_ + auVar133._6_2_ + 0x40;
          auVar179._8_2_ = auVar161._8_2_ + auVar133._8_2_ + 0x40;
          auVar179._10_2_ = auVar161._10_2_ + auVar133._10_2_ + 0x40;
          auVar179._12_2_ = auVar161._12_2_ + auVar133._12_2_ + 0x40;
          auVar179._14_2_ = auVar161._14_2_ + auVar133._14_2_ + 0x40;
          auVar161 = paddsw(auVar179,auVar207);
          auVar180 = psraw(auVar161,7);
          auVar210 = pmaddubsw(auVar147,auVar67);
          auVar209 = pmaddubsw(auVar93,auVar68);
          auVar161 = pmaddubsw(auVar73,auVar70);
          auVar133 = pmaddubsw(auVar115,auVar66);
          auVar116._0_2_ = auVar133._0_2_ + auVar209._0_2_;
          auVar116._2_2_ = auVar133._2_2_ + auVar209._2_2_;
          auVar116._4_2_ = auVar133._4_2_ + auVar209._4_2_;
          auVar116._6_2_ = auVar133._6_2_ + auVar209._6_2_;
          auVar116._8_2_ = auVar133._8_2_ + auVar209._8_2_;
          auVar116._10_2_ = auVar133._10_2_ + auVar209._10_2_;
          auVar116._12_2_ = auVar133._12_2_ + auVar209._12_2_;
          auVar116._14_2_ = auVar133._14_2_ + auVar209._14_2_;
          auVar74._0_2_ = auVar161._0_2_ + auVar210._0_2_ + 0x40;
          auVar74._2_2_ = auVar161._2_2_ + auVar210._2_2_ + 0x40;
          auVar74._4_2_ = auVar161._4_2_ + auVar210._4_2_ + 0x40;
          auVar74._6_2_ = auVar161._6_2_ + auVar210._6_2_ + 0x40;
          auVar74._8_2_ = auVar161._8_2_ + auVar210._8_2_ + 0x40;
          auVar74._10_2_ = auVar161._10_2_ + auVar210._10_2_ + 0x40;
          auVar74._12_2_ = auVar161._12_2_ + auVar210._12_2_ + 0x40;
          auVar74._14_2_ = auVar161._14_2_ + auVar210._14_2_ + 0x40;
          auVar161 = paddsw(auVar74,auVar116);
          auVar161 = psraw(auVar161,7);
          sVar5 = auVar180._0_2_;
          sVar6 = auVar180._2_2_;
          sVar7 = auVar180._4_2_;
          sVar8 = auVar180._6_2_;
          sVar9 = auVar180._8_2_;
          sVar10 = auVar180._10_2_;
          sVar11 = auVar180._12_2_;
          sVar12 = auVar180._14_2_;
          sVar13 = auVar161._0_2_;
          sVar14 = auVar161._2_2_;
          sVar15 = auVar161._4_2_;
          sVar16 = auVar161._6_2_;
          sVar17 = auVar161._8_2_;
          sVar18 = auVar161._10_2_;
          sVar19 = auVar161._12_2_;
          sVar20 = auVar161._14_2_;
          puVar56 = puVar60 + uVar53;
          *puVar56 = (0 < sVar5) * (sVar5 < 0x100) * auVar180[0] - (0xff < sVar5);
          puVar56[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar180[2] - (0xff < sVar6);
          puVar56[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar180[4] - (0xff < sVar7);
          puVar56[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar180[6] - (0xff < sVar8);
          puVar56[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar180[8] - (0xff < sVar9);
          puVar56[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar180[10] - (0xff < sVar10);
          puVar56[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar180[0xc] - (0xff < sVar11);
          puVar56[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar180[0xe] - (0xff < sVar12);
          puVar56[8] = (0 < sVar13) * (sVar13 < 0x100) * auVar161[0] - (0xff < sVar13);
          puVar56[9] = (0 < sVar14) * (sVar14 < 0x100) * auVar161[2] - (0xff < sVar14);
          puVar56[10] = (0 < sVar15) * (sVar15 < 0x100) * auVar161[4] - (0xff < sVar15);
          puVar56[0xb] = (0 < sVar16) * (sVar16 < 0x100) * auVar161[6] - (0xff < sVar16);
          puVar56[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar161[8] - (0xff < sVar17);
          puVar56[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar161[10] - (0xff < sVar18);
          puVar56[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar161[0xc] - (0xff < sVar19);
          puVar56[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar161[0xe] - (0xff < sVar20);
          uVar53 = uVar53 + 0x10;
        } while (uVar53 < (uint)w);
      }
      y0_q4 = y0_q4 + y_step_q4;
      uVar65 = uVar65 + 1;
      puVar60 = puVar60 + dst_stride;
    } while (uVar65 != (uint)h);
  }
  return;
}

Assistant:

void aom_scaled_2d_ssse3(const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
                         ptrdiff_t dst_stride, const InterpKernel *filter,
                         int x0_q4, int x_step_q4, int y0_q4, int y_step_q4,
                         int w, int h) {
  // Note: Fixed size intermediate buffer, temp, places limits on parameters.
  // 2d filtering proceeds in 2 steps:
  //   (1) Interpolate horizontally into an intermediate buffer, temp.
  //   (2) Interpolate temp vertically to derive the sub-pixel result.
  // Deriving the maximum number of rows in the temp buffer (135):
  // --Smallest scaling factor is x1/2 ==> y_step_q4 = 32 (Normative).
  // --Largest block size is 64x64 pixels.
  // --64 rows in the downscaled frame span a distance of (64 - 1) * 32 in the
  //   original frame (in 1/16th pixel units).
  // --Must round-up because block may be located at sub-pixel position.
  // --Require an additional SUBPEL_TAPS rows for the 8-tap filter tails.
  // --((64 - 1) * 32 + 15) >> 4 + 8 = 135.
  // --Require an additional 8 rows for the horiz_w8 transpose tail.
  // When calling in frame scaling function, the smallest scaling factor is x1/4
  // ==> y_step_q4 = 64. Since w and h are at most 16, the temp buffer is still
  // big enough.
  DECLARE_ALIGNED(16, uint8_t, temp[(135 + 8) * 64]);
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= 64);
  assert(h <= 64);
  assert(y_step_q4 <= 32 || (y_step_q4 <= 64 && h <= 32));
  assert(x_step_q4 <= 64);

  if (w >= 8) {
    scaledconvolve_horiz_w8(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  } else {
    scaledconvolve_horiz_w4(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  }

  if (w >= 16) {
    scaledconvolve_vert_w16(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                            dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else if (w == 8) {
    scaledconvolve_vert_w8(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else {
    scaledconvolve_vert_w4(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  }
}